

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O0

void helper_palignr_xmm_x86_64(CPUX86State *env,ZMMReg *d,ZMMReg *s,int32_t shift)

{
  byte bVar1;
  ulong local_118;
  ulong local_110;
  ulong local_100;
  ulong local_f8;
  ulong local_e8;
  ulong local_e0;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_a8;
  ulong local_a0;
  ulong local_90;
  ulong local_88;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ZMMReg r;
  ZMMReg *pZStack_20;
  int32_t shift_local;
  ZMMReg *s_local;
  ZMMReg *d_local;
  CPUX86State *env_local;
  
  if (shift < 0x20) {
    r._l_ZMMReg[0xf] = shift * 8;
    bVar1 = (byte)r._l_ZMMReg[0xf];
    if (((int)r._l_ZMMReg[0xf] < 0x40) && (-0x40 < (int)r._l_ZMMReg[0xf])) {
      if ((int)r._l_ZMMReg[0xf] < 1) {
        local_70 = s->_q_ZMMReg[0] << (-bVar1 & 0x3f);
      }
      else {
        local_70 = s->_q_ZMMReg[0] >> (bVar1 & 0x3f);
      }
      local_78 = local_70;
    }
    else {
      local_78 = 0;
    }
    if (((int)(r._l_ZMMReg[0xf] - 0x40) < 0x40) && (-0x40 < (int)(r._l_ZMMReg[0xf] - 0x40))) {
      if ((int)(r._l_ZMMReg[0xf] - 0x40) < 1) {
        local_88 = s->_q_ZMMReg[1] << (-(bVar1 - 0x40) & 0x3f);
      }
      else {
        local_88 = s->_q_ZMMReg[1] >> (bVar1 - 0x40 & 0x3f);
      }
      local_90 = local_88;
    }
    else {
      local_90 = 0;
    }
    if (((int)(r._l_ZMMReg[0xf] - 0x80) < 0x40) && (-0x40 < (int)(r._l_ZMMReg[0xf] - 0x80))) {
      if ((int)(r._l_ZMMReg[0xf] - 0x80) < 1) {
        local_a0 = d->_q_ZMMReg[0] << (-(bVar1 + 0x80) & 0x3f);
      }
      else {
        local_a0 = d->_q_ZMMReg[0] >> (bVar1 + 0x80 & 0x3f);
      }
      local_a8 = local_a0;
    }
    else {
      local_a8 = 0;
    }
    if (((int)(r._l_ZMMReg[0xf] - 0xc0) < 0x40) && (-0x40 < (int)(r._l_ZMMReg[0xf] - 0xc0))) {
      if ((int)(r._l_ZMMReg[0xf] - 0xc0) < 1) {
        local_b8 = d->_q_ZMMReg[1] << (-(bVar1 + 0x40) & 0x3f);
      }
      else {
        local_b8 = d->_q_ZMMReg[1] >> (bVar1 + 0x40 & 0x3f);
      }
      local_c0 = local_b8;
    }
    else {
      local_c0 = 0;
    }
    local_68 = local_78 | local_90 | local_a8 | local_c0;
    if (((int)(r._l_ZMMReg[0xf] + 0x40) < 0x40) && (-0x40 < (int)(r._l_ZMMReg[0xf] + 0x40))) {
      if ((int)(r._l_ZMMReg[0xf] + 0x40) < 1) {
        local_c8 = s->_q_ZMMReg[0] << (-(bVar1 + 0x40) & 0x3f);
      }
      else {
        local_c8 = s->_q_ZMMReg[0] >> (bVar1 + 0x40 & 0x3f);
      }
      local_d0 = local_c8;
    }
    else {
      local_d0 = 0;
    }
    if (((int)r._l_ZMMReg[0xf] < 0x40) && (-0x40 < (int)r._l_ZMMReg[0xf])) {
      if ((int)r._l_ZMMReg[0xf] < 1) {
        local_e0 = s->_q_ZMMReg[1] << (-bVar1 & 0x3f);
      }
      else {
        local_e0 = s->_q_ZMMReg[1] >> (bVar1 & 0x3f);
      }
      local_e8 = local_e0;
    }
    else {
      local_e8 = 0;
    }
    if (((int)(r._l_ZMMReg[0xf] - 0x40) < 0x40) && (-0x40 < (int)(r._l_ZMMReg[0xf] - 0x40))) {
      if ((int)(r._l_ZMMReg[0xf] - 0x40) < 1) {
        local_f8 = d->_q_ZMMReg[0] << (-(bVar1 - 0x40) & 0x3f);
      }
      else {
        local_f8 = d->_q_ZMMReg[0] >> (bVar1 - 0x40 & 0x3f);
      }
      local_100 = local_f8;
    }
    else {
      local_100 = 0;
    }
    if (((int)(r._l_ZMMReg[0xf] - 0x80) < 0x40) && (-0x40 < (int)(r._l_ZMMReg[0xf] - 0x80))) {
      if ((int)(r._l_ZMMReg[0xf] - 0x80) < 1) {
        local_110 = d->_q_ZMMReg[1] << (-(bVar1 + 0x80) & 0x3f);
      }
      else {
        local_110 = d->_q_ZMMReg[1] >> (bVar1 + 0x80 & 0x3f);
      }
      local_118 = local_110;
    }
    else {
      local_118 = 0;
    }
    r._q_ZMMReg[0] = local_d0 | local_e8 | local_100 | local_118;
  }
  else {
    local_68 = 0;
    r._q_ZMMReg[0] = 0;
    r._l_ZMMReg[0xf] = shift;
  }
  pZStack_20 = s;
  s_local = d;
  d_local = (ZMMReg *)env;
  memcpy(d,&local_68,0x40);
  return;
}

Assistant:

void glue(helper_palignr, SUFFIX)(CPUX86State *env, Reg *d, Reg *s,
                                  int32_t shift)
{
    Reg r;

    /* XXX could be checked during translation */
    if (shift >= (16 << SHIFT)) {
        r.Q(0) = 0;
        XMM_ONLY(r.Q(1) = 0);
    } else {
        shift <<= 3;
#define SHR(v, i) (i < 64 && i > -64 ? i > 0 ? v >> (i) : (v << -(i)) : 0)
#if SHIFT == 0
        r.Q(0) = SHR(s->Q(0), shift - 0) |
            SHR(d->Q(0), shift -  64);
#else
        r.Q(0) = SHR(s->Q(0), shift - 0) |
            SHR(s->Q(1), shift -  64) |
            SHR(d->Q(0), shift - 128) |
            SHR(d->Q(1), shift - 192);
        r.Q(1) = SHR(s->Q(0), shift + 64) |
            SHR(s->Q(1), shift -   0) |
            SHR(d->Q(0), shift -  64) |
            SHR(d->Q(1), shift - 128);
#endif
#undef SHR
    }

    *d = r;
}